

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void dbgwvr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  byte bVar1;
  ArchCPU_conflict2 *cpu_00;
  ulong uVar2;
  int i;
  ARMCPU_conflict1 *cpu;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  cpu_00 = env_archcpu(env);
  bVar1 = ri->crm;
  uVar2 = sextract64(value,0,0x31);
  raw_write(env,ri,uVar2 & 0xfffffffffffffffc);
  hw_watchpoint_update_aarch64(cpu_00,(uint)bVar1);
  return;
}

Assistant:

static void dbgwvr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                         uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    int i = ri->crm;

    /* Bits [63:49] are hardwired to the value of bit [48]; that is, the
     * register reads and behaves as if values written are sign extended.
     * Bits [1:0] are RES0.
     */
    value = sextract64(value, 0, 49) & ~3ULL;

    raw_write(env, ri, value);
    hw_watchpoint_update(cpu, i);
}